

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# CoreBroker.cpp
# Opt level: O0

void __thiscall helics::CoreBroker::generateTimeBarrier(CoreBroker *this,ActionMessage *message)

{
  bool bVar1;
  BaseType BVar2;
  ActionMessage *in_RSI;
  long in_RDI;
  ActionMessage cancelBarrier;
  undefined4 in_stack_ffffffffffffff00;
  BaseType in_stack_ffffffffffffff04;
  GlobalFederateId local_ec [2];
  action_t startingAction;
  ActionMessage *in_stack_ffffffffffffff20;
  ActionMessage *in_stack_ffffffffffffff28;
  undefined4 in_stack_ffffffffffffff30;
  GlobalBrokerId id;
  GlobalFederateId in_stack_ffffffffffffff34;
  int local_c4;
  
  startingAction = (action_t)((ulong)stack0xffffffffffffff18 >> 0x20);
  bVar1 = checkActionFlag<helics::ActionMessage,helics::OperationFlags>(in_RSI,cancel_flag);
  if (bVar1) {
    ActionMessage::ActionMessage(in_stack_ffffffffffffff20,startingAction);
    id.gid = *(BaseType *)(in_RDI + 0x14);
    GlobalFederateId::GlobalFederateId((GlobalFederateId *)&stack0xffffffffffffff34,id);
    if (local_c4 == 0) {
      in_stack_ffffffffffffff04 = GlobalBrokerId::baseValue((GlobalBrokerId *)(in_RDI + 0x14));
    }
    register0x00000000 = TimeRepresentation<count_time<9,_long>_>::maxVal();
    *(baseType *)(in_RDI + 0xde0) = register0x00000000;
    broadcast((CoreBroker *)CONCAT44(in_stack_ffffffffffffff34.gid,id.gid),in_stack_ffffffffffffff28
             );
    ActionMessage::~ActionMessage
              ((ActionMessage *)CONCAT44(in_stack_ffffffffffffff04,in_stack_ffffffffffffff00));
  }
  else {
    ActionMessage::setAction(in_RSI,cmd_time_barrier);
    GlobalFederateId::GlobalFederateId(local_ec,(GlobalBrokerId)*(BaseType *)(in_RDI + 0x14));
    (in_RSI->source_id).gid = local_ec[0].gid;
    if (in_RSI->messageID == 0) {
      BVar2 = GlobalBrokerId::baseValue((GlobalBrokerId *)(in_RDI + 0x14));
      in_RSI->messageID = BVar2;
    }
    *(baseType *)(in_RDI + 0xde0) = (in_RSI->actionTime).internalTimeCode;
    broadcast((CoreBroker *)CONCAT44(in_stack_ffffffffffffff34.gid,in_stack_ffffffffffffff30),
              in_stack_ffffffffffffff28);
  }
  return;
}

Assistant:

void CoreBroker::generateTimeBarrier(ActionMessage& message)
{
    if (checkActionFlag(message, cancel_flag)) {
        ActionMessage cancelBarrier(CMD_TIME_BARRIER_CLEAR);
        cancelBarrier.source_id = global_broker_id_local;
        if (cancelBarrier.messageID == 0) {
            cancelBarrier.messageID = global_broker_id_local.baseValue();
        }
        mNextTimeBarrier = Time::maxVal();
        broadcast(cancelBarrier);
        return;
    }
    message.setAction(CMD_TIME_BARRIER);
    message.source_id = global_broker_id_local;
    if (message.messageID == 0) {
        message.messageID = global_broker_id_local.baseValue();
    }
    mNextTimeBarrier = message.actionTime;
    // time should already be set
    broadcast(message);
}